

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int ASN1_STRING_print_ex(BIO *out,ASN1_STRING *str,ulong flags)

{
  int iVar1;
  size_t sVar2;
  char local_41;
  int len;
  int iStack_3c;
  char quotes;
  int len_1;
  int encoding;
  char *tagname;
  int outlen;
  int type;
  unsigned_long flags_local;
  ASN1_STRING *str_local;
  BIO *out_local;
  
  tagname._4_4_ = str->type;
  tagname._0_4_ = 0;
  _outlen = flags;
  flags_local = (unsigned_long)str;
  str_local = (ASN1_STRING *)out;
  if ((flags & 0x40) != 0) {
    _len_1 = ASN1_tag2str(tagname._4_4_);
    sVar2 = strlen(_len_1);
    tagname._0_4_ = (int)tagname + (int)sVar2;
    iVar1 = maybe_write((BIO *)str_local,_len_1,(int)tagname);
    if ((iVar1 == 0) || (iVar1 = maybe_write((BIO *)str_local,":",1), iVar1 == 0)) {
      return -1;
    }
    tagname._0_4_ = (int)tagname + 1;
  }
  if ((_outlen & 0x80) == 0) {
    if ((_outlen & 0x20) == 0) {
      iStack_3c = string_type_to_encoding(tagname._4_4_);
      if ((iStack_3c == -1) && ((_outlen & 0x100) == 0)) {
        iStack_3c = 0x1001;
      }
    }
    else {
      iStack_3c = 0x1001;
    }
  }
  else {
    iStack_3c = -1;
  }
  if (iStack_3c == -1) {
    iVar1 = do_dump(_outlen,(BIO *)str_local,(ASN1_STRING *)flags_local);
    if (iVar1 < 0) {
      out_local._4_4_ = -1;
    }
    else {
      out_local._4_4_ = iVar1 + (int)tagname;
    }
  }
  else {
    local_41 = '\0';
    iVar1 = do_buf(*(uchar **)(flags_local + 8),*(int *)flags_local,iStack_3c,_outlen,&local_41,
                   (BIO *)0x0);
    if (iVar1 < 0) {
      out_local._4_4_ = -1;
    }
    else {
      tagname._0_4_ = iVar1 + (int)tagname;
      if (local_41 != '\0') {
        tagname._0_4_ = (int)tagname + 2;
      }
      if (str_local == (ASN1_STRING *)0x0) {
        out_local._4_4_ = (int)tagname;
      }
      else if ((((local_41 == '\0') || (iVar1 = maybe_write((BIO *)str_local,"\"",1), iVar1 != 0))
               && (iVar1 = do_buf(*(uchar **)(flags_local + 8),*(int *)flags_local,iStack_3c,_outlen
                                  ,(char *)0x0,(BIO *)str_local), -1 < iVar1)) &&
              ((local_41 == '\0' || (iVar1 = maybe_write((BIO *)str_local,"\"",1), iVar1 != 0)))) {
        out_local._4_4_ = (int)tagname;
      }
      else {
        out_local._4_4_ = -1;
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

int ASN1_STRING_print_ex(BIO *out, const ASN1_STRING *str,
                         unsigned long flags) {
  int type = str->type;
  int outlen = 0;
  if (flags & ASN1_STRFLGS_SHOW_TYPE) {
    const char *tagname = ASN1_tag2str(type);
    outlen += strlen(tagname);
    if (!maybe_write(out, tagname, outlen) || !maybe_write(out, ":", 1)) {
      return -1;
    }
    outlen++;
  }

  // Decide what to do with |str|, either dump the contents or display it.
  int encoding;
  if (flags & ASN1_STRFLGS_DUMP_ALL) {
    // Dump everything.
    encoding = -1;
  } else if (flags & ASN1_STRFLGS_IGNORE_TYPE) {
    // Ignore the string type and interpret the contents as Latin-1.
    encoding = MBSTRING_ASC;
  } else {
    encoding = string_type_to_encoding(type);
    if (encoding == -1 && (flags & ASN1_STRFLGS_DUMP_UNKNOWN) == 0) {
      encoding = MBSTRING_ASC;
    }
  }

  if (encoding == -1) {
    int len = do_dump(flags, out, str);
    if (len < 0) {
      return -1;
    }
    outlen += len;
    return outlen;
  }

  // Measure the length.
  char quotes = 0;
  int len = do_buf(str->data, str->length, encoding, flags, &quotes, NULL);
  if (len < 0) {
    return -1;
  }
  outlen += len;
  if (quotes) {
    outlen += 2;
  }
  if (!out) {
    return outlen;
  }

  // Encode the value.
  if ((quotes && !maybe_write(out, "\"", 1)) ||
      do_buf(str->data, str->length, encoding, flags, NULL, out) < 0 ||
      (quotes && !maybe_write(out, "\"", 1))) {
    return -1;
  }
  return outlen;
}